

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O2

void __thiscall Sphere::~Sphere(Sphere *this)

{
  Object3D::~Object3D(&this->super_Object3D);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Sphere() {}